

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_decoder.c
# Opt level: O2

aom_codec_err_t aom_codec_decode(aom_codec_ctx_t *ctx,uint8_t *data,size_t data_sz,void *user_priv)

{
  aom_codec_err_t aVar1;
  
  if (ctx != (aom_codec_ctx_t *)0x0) {
    aVar1 = AOM_CODEC_ERROR;
    if ((ctx->iface != (aom_codec_iface_t *)0x0) &&
       ((aom_codec_alg_priv_t_conflict *)ctx->priv != (aom_codec_alg_priv_t_conflict *)0x0)) {
      aVar1 = (*(ctx->iface->dec).decode)
                        ((aom_codec_alg_priv_t_conflict *)ctx->priv,data,data_sz,user_priv);
    }
    ctx->err = aVar1;
    return aVar1;
  }
  return AOM_CODEC_INVALID_PARAM;
}

Assistant:

aom_codec_err_t aom_codec_decode(aom_codec_ctx_t *ctx, const uint8_t *data,
                                 size_t data_sz, void *user_priv) {
  aom_codec_err_t res;

  if (!ctx)
    res = AOM_CODEC_INVALID_PARAM;
  else if (!ctx->iface || !ctx->priv)
    res = AOM_CODEC_ERROR;
  else {
    res = ctx->iface->dec.decode(get_alg_priv(ctx), data, data_sz, user_priv);
  }

  return SAVE_STATUS(ctx, res);
}